

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::ProfiledNewInstanceNoArg
              (RecyclableObject *function,ScriptContext *scriptContext,ArrayCallSiteInfo *arrayInfo,
              RecyclerWeakReference<Js::FunctionBody> *weakFuncRef)

{
  code *pcVar1;
  bool bVar2;
  ThreadContext *threadContext;
  JavascriptFunction *this;
  FunctionInfo *pFVar3;
  undefined4 *puVar4;
  JavascriptLibrary *pJVar5;
  JavascriptNativeFloatArray *arr_1;
  JavascriptNativeIntArray *arr;
  undefined1 local_50 [8];
  JsReentLock reentrancylock;
  RecyclerWeakReference<Js::FunctionBody> *weakFuncRef_local;
  ArrayCallSiteInfo *arrayInfo_local;
  ScriptContext *scriptContext_local;
  RecyclableObject *function_local;
  
  reentrancylock._24_8_ = weakFuncRef;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_50,threadContext);
  bVar2 = VarIs<Js::JavascriptFunction,Js::RecyclableObject>(function);
  if (bVar2) {
    this = VarTo<Js::JavascriptFunction,Js::RecyclableObject>(function);
    pFVar3 = JavascriptFunction::GetFunctionInfo(this);
    if (pFVar3 == (FunctionInfo *)EntryInfo::NewInstance) goto LAB_010c4160;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                              ,0x532,
                              "(VarIs<JavascriptFunction>(function) && VarTo<JavascriptFunction>(function)->GetFunctionInfo() == &JavascriptArray::EntryInfo::NewInstance)"
                              ,
                              "VarIs<JavascriptFunction>(function) && VarTo<JavascriptFunction>(function)->GetFunctionInfo() == &JavascriptArray::EntryInfo::NewInstance"
                             );
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 0;
LAB_010c4160:
  bVar2 = ArrayCallSiteInfo::IsNativeIntArray(arrayInfo);
  if (bVar2) {
    pJVar5 = ScriptContext::GetLibrary(scriptContext);
    function_local = (RecyclableObject *)JavascriptLibrary::CreateNativeIntArray(pJVar5);
    JavascriptNativeArray::SetArrayProfileInfo
              ((JavascriptNativeArray *)function_local,
               (RecyclerWeakReference<Js::FunctionBody> *)reentrancylock._24_8_,arrayInfo);
  }
  else {
    bVar2 = ArrayCallSiteInfo::IsNativeFloatArray(arrayInfo);
    if (bVar2) {
      pJVar5 = ScriptContext::GetLibrary(scriptContext);
      function_local = (RecyclableObject *)JavascriptLibrary::CreateNativeFloatArray(pJVar5);
      JavascriptNativeArray::SetArrayProfileInfo
                ((JavascriptNativeArray *)function_local,
                 (RecyclerWeakReference<Js::FunctionBody> *)reentrancylock._24_8_,arrayInfo);
    }
    else {
      pJVar5 = ScriptContext::GetLibrary(scriptContext);
      function_local = (RecyclableObject *)JavascriptLibrary::CreateArray(pJVar5);
    }
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_50);
  return function_local;
}

Assistant:

Var JavascriptArray::ProfiledNewInstanceNoArg(RecyclableObject *function, ScriptContext *scriptContext, ArrayCallSiteInfo *arrayInfo, RecyclerWeakReference<FunctionBody> *weakFuncRef)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrArr_ProfiledNewInstanceNoArg, reentrancylock, scriptContext->GetThreadContext());
        Assert(VarIs<JavascriptFunction>(function) &&
               VarTo<JavascriptFunction>(function)->GetFunctionInfo() == &JavascriptArray::EntryInfo::NewInstance);

        if (arrayInfo->IsNativeIntArray())
        {
            JavascriptNativeIntArray *arr = scriptContext->GetLibrary()->CreateNativeIntArray();
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);
            return arr;
        }

        if (arrayInfo->IsNativeFloatArray())
        {
            JavascriptNativeFloatArray *arr = scriptContext->GetLibrary()->CreateNativeFloatArray();
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);
            return arr;
        }

        return scriptContext->GetLibrary()->CreateArray();
        JIT_HELPER_END(ScrArr_ProfiledNewInstanceNoArg);
    }